

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O3

void client_timeout_handler(cio_timer *timer,void *handler_context,cio_error err)

{
  if (err != CIO_SUCCESS) {
    return;
  }
  client_timeout_handler_cold_1();
  return;
}

Assistant:

static void client_timeout_handler(struct cio_timer *timer, void *handler_context, enum cio_error err)
{
	(void)timer;

	if (err == CIO_SUCCESS) {
		struct cio_http_client *client = handler_context;
		err = write_response(client, CIO_HTTP_STATUS_TIMEOUT, NULL, NULL);
		if (cio_unlikely(err != CIO_SUCCESS)) {
			mark_to_be_closed(client);
		}
	}
}